

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_request_pty_size_ex
              (LIBSSH2_CHANNEL *channel,int width,int height,int width_px,int height_px)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  uchar *local_50;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uchar *local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = -0x27;
  }
  else {
    local_48 = width;
    local_44 = height;
    local_40 = width_px;
    local_3c = height_px;
    start_time = time((time_t *)0x0);
    local_38 = channel->reqPTY_packet + 1;
    while( true ) {
      session = channel->session;
      if (channel->reqPTY_state != libssh2_NB_state_created) break;
LAB_0010abdc:
      iVar1 = _libssh2_transport_send
                        (session,channel->reqPTY_packet,channel->reqPTY_packet_len,(uchar *)0x0,0);
      if (iVar1 == -0x25) {
        _libssh2_error(session,-0x25,"Would block sending window-change request");
      }
      else {
        if (iVar1 == 0) {
          _libssh2_htonu32(channel->reqPTY_local_channel,(channel->local).id);
          iVar1 = 0;
          goto LAB_0010ac68;
        }
        channel->reqPTY_state = libssh2_NB_state_idle;
        iVar1 = _libssh2_error(session,iVar1,"Unable to send window-change packet");
        if (iVar1 != -0x25) {
          return iVar1;
        }
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(channel->session,start_time);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (channel->reqPTY_state == libssh2_NB_state_idle) {
      channel->reqPTY_packet_len = 0x27;
      (channel->reqPTY_packet_requirev_state).start = 0;
      local_50 = local_38;
      channel->reqPTY_packet[0] = 'b';
      _libssh2_store_u32(&local_50,(channel->remote).id);
      _libssh2_store_str(&local_50,"window-change",0xd);
      *local_50 = '\0';
      local_50 = local_50 + 1;
      _libssh2_store_u32(&local_50,local_48);
      _libssh2_store_u32(&local_50,local_44);
      _libssh2_store_u32(&local_50,local_40);
      _libssh2_store_u32(&local_50,local_3c);
      channel->reqPTY_state = libssh2_NB_state_created;
      goto LAB_0010abdc;
    }
    iVar1 = -0xe;
LAB_0010ac68:
    channel->reqPTY_state = libssh2_NB_state_idle;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_pty_size_ex(LIBSSH2_CHANNEL *channel, int width,
                                    int height, int width_px, int height_px)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_request_pty_size(channel, width, height, width_px,
                                          height_px));
    return rc;
}